

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arrow_type_extension.cpp
# Opt level: O0

bool __thiscall duckdb::DBConfig::HasArrowExtension(DBConfig *this,LogicalType *type)

{
  bool bVar1;
  vector<duckdb::ArrowExtensionMetadata,_std::allocator<duckdb::ArrowExtensionMetadata>_> *this_00;
  TypeInfo *in_RDI;
  TypeInfo type_info;
  lock_guard<std::mutex> l;
  key_type *in_stack_ffffffffffffff78;
  unordered_map<duckdb::TypeInfo,_duckdb::vector<duckdb::ArrowExtensionMetadata,_true>,_duckdb::HashTypeInfo,_std::equal_to<duckdb::TypeInfo>,_std::allocator<std::pair<const_duckdb::TypeInfo,_duckdb::vector<duckdb::ArrowExtensionMetadata,_true>_>_>_>
  *in_stack_ffffffffffffff80;
  LogicalType *in_stack_ffffffffffffff98;
  undefined1 local_1;
  
  unique_ptr<duckdb::ArrowTypeExtensionSet,_std::default_delete<duckdb::ArrowTypeExtensionSet>,_true>
  ::operator->((unique_ptr<duckdb::ArrowTypeExtensionSet,_std::default_delete<duckdb::ArrowTypeExtensionSet>,_true>
                *)in_stack_ffffffffffffff80);
  ::std::lock_guard<std::mutex>::lock_guard
            ((lock_guard<std::mutex> *)in_stack_ffffffffffffff80,
             (mutex_type *)in_stack_ffffffffffffff78);
  TypeInfo::TypeInfo(in_RDI,in_stack_ffffffffffffff98);
  unique_ptr<duckdb::ArrowTypeExtensionSet,_std::default_delete<duckdb::ArrowTypeExtensionSet>,_true>
  ::operator->((unique_ptr<duckdb::ArrowTypeExtensionSet,_std::default_delete<duckdb::ArrowTypeExtensionSet>,_true>
                *)in_stack_ffffffffffffff80);
  this_00 = &::std::
             unordered_map<duckdb::TypeInfo,_duckdb::vector<duckdb::ArrowExtensionMetadata,_true>,_duckdb::HashTypeInfo,_std::equal_to<duckdb::TypeInfo>,_std::allocator<std::pair<const_duckdb::TypeInfo,_duckdb::vector<duckdb::ArrowExtensionMetadata,_true>_>_>_>
             ::operator[](in_stack_ffffffffffffff80,in_stack_ffffffffffffff78)->
             super_vector<duckdb::ArrowExtensionMetadata,_std::allocator<duckdb::ArrowExtensionMetadata>_>
  ;
  bVar1 = ::std::
          vector<duckdb::ArrowExtensionMetadata,_std::allocator<duckdb::ArrowExtensionMetadata>_>::
          empty(this_00);
  if (bVar1) {
    unique_ptr<duckdb::ArrowTypeExtensionSet,_std::default_delete<duckdb::ArrowTypeExtensionSet>,_true>
    ::operator->((unique_ptr<duckdb::ArrowTypeExtensionSet,_std::default_delete<duckdb::ArrowTypeExtensionSet>,_true>
                  *)in_stack_ffffffffffffff80);
    ::std::
    unordered_map<duckdb::TypeInfo,_duckdb::vector<duckdb::ArrowExtensionMetadata,_true>,_duckdb::HashTypeInfo,_std::equal_to<duckdb::TypeInfo>,_std::allocator<std::pair<const_duckdb::TypeInfo,_duckdb::vector<duckdb::ArrowExtensionMetadata,_true>_>_>_>
    ::operator[](in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
    bVar1 = ::std::
            vector<duckdb::ArrowExtensionMetadata,_std::allocator<duckdb::ArrowExtensionMetadata>_>
            ::empty(this_00);
    local_1 = (bool)((bVar1 ^ 0xffU) & 1);
  }
  else {
    local_1 = true;
  }
  TypeInfo::~TypeInfo((TypeInfo *)0x15227d5);
  ::std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0x15227df);
  return local_1;
}

Assistant:

bool DBConfig::HasArrowExtension(const LogicalType &type) const {
	lock_guard<mutex> l(arrow_extensions->lock);
	TypeInfo type_info(type);
	if (!arrow_extensions->type_to_info[type_info].empty()) {
		return true;
	}
	type_info.type = LogicalTypeId::ANY;
	return !arrow_extensions->type_to_info[type_info].empty();
}